

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinx.hpp
# Opt level: O3

void __thiscall Jinx::Impl::Parser::ParseExpression(Parser *this,SymbolListCItr endSymbol)

{
  Symbol *pSVar1;
  pointer pDVar2;
  ulong uVar3;
  byte bVar4;
  uint32_t uVar5;
  Symbol *pSVar6;
  SymbolList *pSVar7;
  uint8_t *puVar8;
  ulong uVar9;
  pointer pSVar10;
  pointer *ppSVar11;
  pointer pSVar12;
  int iVar13;
  int iVar14;
  Opcode val;
  SymbolListCItr SVar15;
  pointer pSVar16;
  ulong uVar17;
  element_type *peVar18;
  DebugLineEntry local_30;
  
  if (this->m_error == true) {
    pSVar6 = (this->m_currentSymbol)._M_current;
LAB_00207ff0:
    SVar15._M_current = endSymbol._M_current;
    if (pSVar6 != endSymbol._M_current) {
      do {
        SVar15._M_current = endSymbol._M_current;
        if ((pSVar6 == (this->m_symbolList->
                       super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)
                       ._M_impl.super__Vector_impl_data._M_finish) ||
           (SVar15._M_current = pSVar6, pSVar6->type == Comma)) break;
        pSVar6 = pSVar6 + 1;
        SVar15._M_current = endSymbol._M_current;
      } while (pSVar6 != endSymbol._M_current);
    }
    ParseSubexpression(this,SVar15);
    if (this->m_error != false) {
      return;
    }
    pSVar7 = this->m_symbolList;
    pSVar10 = (this->m_currentSymbol)._M_current;
    if (pSVar10 ==
        (pSVar7->super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
        _M_impl.super__Vector_impl_data._M_finish) {
      return;
    }
    if (pSVar10->type != Comma) {
      return;
    }
    iVar13 = 1;
    do {
      this->m_lastLine = pSVar10->lineNumber;
      pSVar6 = pSVar10 + 1;
      (this->m_currentSymbol)._M_current = pSVar6;
      if ((pSVar6 != (pSVar7->
                     super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                     _M_impl.super__Vector_impl_data._M_finish) && (pSVar6->type == NewLine)) {
        this->m_lastLine = pSVar10[1].lineNumber;
        pSVar6 = pSVar10 + 2;
        (this->m_currentSymbol)._M_current = pSVar6;
      }
      SVar15._M_current = endSymbol._M_current;
      if (pSVar6 != endSymbol._M_current) {
        do {
          SVar15._M_current = endSymbol._M_current;
          if ((pSVar6 == (pSVar7->
                         super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                         )._M_impl.super__Vector_impl_data._M_finish) ||
             (SVar15._M_current = pSVar6, pSVar6->type == Comma)) break;
          pSVar6 = pSVar6 + 1;
          SVar15._M_current = endSymbol._M_current;
        } while (pSVar6 != endSymbol._M_current);
      }
      ParseSubexpression(this,SVar15);
      iVar13 = iVar13 + 1;
      if (this->m_error != false) goto LAB_002080ed;
      pSVar7 = this->m_symbolList;
      pSVar10 = (this->m_currentSymbol)._M_current;
      if ((pSVar10 ==
           (pSVar7->super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
           _M_impl.super__Vector_impl_data._M_finish) || (pSVar10->type != Comma))
      goto LAB_002080ed;
    } while( true );
  }
  pSVar7 = this->m_symbolList;
  pSVar6 = (this->m_currentSymbol)._M_current;
  if ((pSVar6 == (pSVar7->
                 super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                 _M_impl.super__Vector_impl_data._M_finish) || (pSVar6->type != SquareOpen))
  goto LAB_00207ff0;
  this->m_lastLine = pSVar6->lineNumber;
  pSVar1 = pSVar6 + 1;
  (this->m_currentSymbol)._M_current = pSVar1;
  if ((pSVar1 != (pSVar7->
                 super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                 _M_impl.super__Vector_impl_data._M_finish) && (pSVar1->type == SquareClose)) {
    uVar5 = pSVar6[1].lineNumber;
    this->m_lastLine = uVar5;
    (this->m_currentSymbol)._M_current = pSVar6 + 2;
    if ((CommonData::globalParams.enableDebugInfo == true) &&
       ((pDVar2 = (this->m_debugLines).
                  super__Vector_base<Jinx::Impl::DebugLineEntry,_Jinx::StaticAllocator<Jinx::Impl::DebugLineEntry,_8192UL,_16UL>_>
                  ._M_impl.super__Vector_impl_data._M_finish,
        (this->m_debugLines).
        super__Vector_base<Jinx::Impl::DebugLineEntry,_Jinx::StaticAllocator<Jinx::Impl::DebugLineEntry,_8192UL,_16UL>_>
        ._M_impl.super__Vector_impl_data._M_start == pDVar2 || (pDVar2[-1].lineNumber != uVar5)))) {
      local_30.lineNumber = uVar5;
      local_30.opcodePosition = (uint32_t)(this->m_writer).m_pos;
      std::
      vector<Jinx::Impl::DebugLineEntry,_Jinx::StaticAllocator<Jinx::Impl::DebugLineEntry,_8192UL,_16UL>_>
      ::emplace_back<Jinx::Impl::DebugLineEntry>(&this->m_debugLines,&local_30);
    }
    BinaryWriter::Write<Jinx::Impl::Opcode,unsigned_char>(&this->m_writer,PushColl);
    peVar18 = (this->m_writer).m_buffer.super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    uVar9 = (this->m_writer).m_pos;
    if (peVar18->m_size < uVar9) goto LAB_002084d3;
    uVar3 = peVar18->m_capacity;
    if (uVar3 < uVar9 + 4) {
      uVar17 = uVar3 + (uVar3 >> 1) + 4;
      puVar8 = peVar18->m_data;
      if (uVar3 <= uVar17 && uVar17 - uVar3 != 0) {
        if (puVar8 != (uint8_t *)0x0) {
          LOCK();
          Mem::freeCount.super___atomic_base<unsigned_long>._M_i =
               (__atomic_base<unsigned_long>)
               ((long)Mem::freeCount.super___atomic_base<unsigned_long>._M_i + 1);
          UNLOCK();
        }
        LOCK();
        Mem::allocationCount.super___atomic_base<unsigned_long>._M_i =
             (__atomic_base<unsigned_long>)
             ((long)Mem::allocationCount.super___atomic_base<unsigned_long>._M_i + 1);
        UNLOCK();
        LOCK();
        Mem::allocatedMemory.super___atomic_base<unsigned_long>._M_i =
             (__atomic_base<unsigned_long>)
             ((long)Mem::allocatedMemory.super___atomic_base<unsigned_long>._M_i + (uVar17 - uVar3))
        ;
        UNLOCK();
        puVar8 = (uint8_t *)
                 std::function<void_*(void_*,_unsigned_long,_unsigned_long)>::operator()
                           (&Mem::reallocFn,puVar8,uVar17,uVar3);
        peVar18->m_data = puVar8;
        peVar18->m_capacity = uVar17;
        uVar9 = (this->m_writer).m_pos;
      }
    }
    else {
      puVar8 = peVar18->m_data;
    }
    puVar8 = puVar8 + uVar9;
    puVar8[0] = '\0';
    puVar8[1] = '\0';
    puVar8[2] = '\0';
    puVar8[3] = '\0';
    goto LAB_00208297;
  }
  ParseSubexpression(this,endSymbol);
  if (((this->m_error != false) ||
      (pSVar10 = (this->m_currentSymbol)._M_current,
      pSVar10 ==
      (this->m_symbolList->
      super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)._M_impl.
      super__Vector_impl_data._M_finish)) || (pSVar10->type != Comma)) {
    Error<>(this,"Expected comma separating key-value pair");
    return;
  }
  this->m_lastLine = pSVar10->lineNumber;
  (this->m_currentSymbol)._M_current = pSVar10 + 1;
  ParseExpression(this,endSymbol);
  if (((this->m_error == false) &&
      (pSVar10 = (this->m_currentSymbol)._M_current,
      pSVar10 !=
      (this->m_symbolList->
      super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)._M_impl.
      super__Vector_impl_data._M_finish)) && (pSVar10->type == SquareClose)) {
    this->m_lastLine = pSVar10->lineNumber;
    (this->m_currentSymbol)._M_current = pSVar10 + 1;
    bVar4 = 0;
  }
  else {
    local_30 = (DebugLineEntry)CommonData::symbolTypeName[0x15];
    Error<char_const*>(this,"Expected symbol %s",(char **)&local_30);
    bVar4 = this->m_error;
  }
  iVar13 = 1;
  if ((bVar4 & 1) == 0) {
    pSVar7 = this->m_symbolList;
    pSVar10 = (this->m_currentSymbol)._M_current;
    if (pSVar10 !=
        (pSVar7->super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
        _M_impl.super__Vector_impl_data._M_finish) {
      iVar14 = iVar13;
      do {
        ppSVar11 = &(pSVar7->
                    super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
        iVar13 = iVar14;
        if (pSVar10->type != Comma) break;
        this->m_lastLine = pSVar10->lineNumber;
        pSVar12 = pSVar10 + 1;
        (this->m_currentSymbol)._M_current = pSVar12;
        pSVar16 = *ppSVar11;
        if (pSVar12 == pSVar16) {
LAB_0020837d:
          local_30 = (DebugLineEntry)CommonData::symbolTypeName[0x14];
          Error<char_const*>(this,"Expected symbol %s",(char **)&local_30);
        }
        else {
          if (pSVar12->type == NewLine) {
            this->m_lastLine = pSVar10[1].lineNumber;
            pSVar12 = pSVar10 + 2;
            (this->m_currentSymbol)._M_current = pSVar12;
            pSVar16 = *ppSVar11;
          }
          if ((pSVar12 == pSVar16) || (pSVar12->type != SquareOpen)) goto LAB_0020837d;
          this->m_lastLine = pSVar12->lineNumber;
          (this->m_currentSymbol)._M_current = pSVar12 + 1;
        }
        ParseSubexpression(this,endSymbol);
        if (((this->m_error == false) &&
            (pSVar10 = (this->m_currentSymbol)._M_current,
            pSVar10 !=
            (this->m_symbolList->
            super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)._M_impl.
            super__Vector_impl_data._M_finish)) && (pSVar10->type == Comma)) {
          this->m_lastLine = pSVar10->lineNumber;
          (this->m_currentSymbol)._M_current = pSVar10 + 1;
        }
        else {
          local_30 = (DebugLineEntry)CommonData::symbolTypeName[0xf];
          Error<char_const*>(this,"Expected symbol %s",(char **)&local_30);
        }
        ParseSubexpression(this,endSymbol);
        if (((this->m_error == false) &&
            (pSVar10 = (this->m_currentSymbol)._M_current,
            pSVar10 !=
            (this->m_symbolList->
            super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)._M_impl.
            super__Vector_impl_data._M_finish)) && (pSVar10->type == SquareClose)) {
          this->m_lastLine = pSVar10->lineNumber;
          (this->m_currentSymbol)._M_current = pSVar10 + 1;
        }
        else {
          local_30 = (DebugLineEntry)CommonData::symbolTypeName[0x15];
          Error<char_const*>(this,"Expected symbol %s",(char **)&local_30);
          iVar13 = iVar14 + 1;
          if ((this->m_error & 1U) != 0) break;
        }
        iVar13 = iVar14 + 1;
        pSVar7 = this->m_symbolList;
        pSVar10 = (this->m_currentSymbol)._M_current;
        iVar14 = iVar13;
      } while (pSVar10 !=
               (pSVar7->super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
               )._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  if (CommonData::globalParams.enableDebugInfo == true) {
    pDVar2 = (this->m_debugLines).
             super__Vector_base<Jinx::Impl::DebugLineEntry,_Jinx::StaticAllocator<Jinx::Impl::DebugLineEntry,_8192UL,_16UL>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((this->m_debugLines).
        super__Vector_base<Jinx::Impl::DebugLineEntry,_Jinx::StaticAllocator<Jinx::Impl::DebugLineEntry,_8192UL,_16UL>_>
        ._M_impl.super__Vector_impl_data._M_start == pDVar2) {
      uVar5 = this->m_lastLine;
    }
    else {
      uVar5 = this->m_lastLine;
      if (pDVar2[-1].lineNumber == uVar5) goto LAB_002084c2;
    }
    local_30.lineNumber = uVar5;
    local_30.opcodePosition = (uint32_t)(this->m_writer).m_pos;
    std::
    vector<Jinx::Impl::DebugLineEntry,_Jinx::StaticAllocator<Jinx::Impl::DebugLineEntry,_8192UL,_16UL>_>
    ::emplace_back<Jinx::Impl::DebugLineEntry>(&this->m_debugLines,&local_30);
  }
LAB_002084c2:
  val = PushColl;
  goto LAB_00208203;
LAB_002080ed:
  if (CommonData::globalParams.enableDebugInfo == true) {
    pDVar2 = (this->m_debugLines).
             super__Vector_base<Jinx::Impl::DebugLineEntry,_Jinx::StaticAllocator<Jinx::Impl::DebugLineEntry,_8192UL,_16UL>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((this->m_debugLines).
        super__Vector_base<Jinx::Impl::DebugLineEntry,_Jinx::StaticAllocator<Jinx::Impl::DebugLineEntry,_8192UL,_16UL>_>
        ._M_impl.super__Vector_impl_data._M_start == pDVar2) {
      uVar5 = this->m_lastLine;
    }
    else {
      uVar5 = this->m_lastLine;
      if (pDVar2[-1].lineNumber == uVar5) goto LAB_002081f7;
    }
    local_30.lineNumber = uVar5;
    local_30.opcodePosition = (uint32_t)(this->m_writer).m_pos;
    std::
    vector<Jinx::Impl::DebugLineEntry,_Jinx::StaticAllocator<Jinx::Impl::DebugLineEntry,_8192UL,_16UL>_>
    ::emplace_back<Jinx::Impl::DebugLineEntry>(&this->m_debugLines,&local_30);
  }
LAB_002081f7:
  val = PushList;
LAB_00208203:
  BinaryWriter::Write<Jinx::Impl::Opcode,unsigned_char>(&this->m_writer,val);
  peVar18 = (this->m_writer).m_buffer.super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  uVar9 = (this->m_writer).m_pos;
  if (peVar18->m_size < uVar9) {
LAB_002084d3:
    __assert_fail("*pos <= m_size",
                  "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Tests/UnitTests/../../Include/Jinx.hpp"
                  ,0xb6f,"void Jinx::Buffer::Write(size_t *, const void *, size_t)");
  }
  uVar3 = peVar18->m_capacity;
  if (uVar3 < uVar9 + 4) {
    uVar17 = uVar3 + (uVar3 >> 1) + 4;
    puVar8 = peVar18->m_data;
    if (uVar3 <= uVar17 && uVar17 - uVar3 != 0) {
      if (puVar8 != (uint8_t *)0x0) {
        LOCK();
        Mem::freeCount.super___atomic_base<unsigned_long>._M_i =
             (__atomic_base<unsigned_long>)
             ((long)Mem::freeCount.super___atomic_base<unsigned_long>._M_i + 1);
        UNLOCK();
      }
      LOCK();
      Mem::allocationCount.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)
           ((long)Mem::allocationCount.super___atomic_base<unsigned_long>._M_i + 1);
      UNLOCK();
      LOCK();
      Mem::allocatedMemory.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)
           ((long)Mem::allocatedMemory.super___atomic_base<unsigned_long>._M_i + (uVar17 - uVar3));
      UNLOCK();
      puVar8 = (uint8_t *)
               std::function<void_*(void_*,_unsigned_long,_unsigned_long)>::operator()
                         (&Mem::reallocFn,puVar8,uVar17,uVar3);
      peVar18->m_data = puVar8;
      peVar18->m_capacity = uVar17;
      uVar9 = (this->m_writer).m_pos;
    }
  }
  else {
    puVar8 = peVar18->m_data;
  }
  *(int *)(puVar8 + uVar9) = iVar13;
LAB_00208297:
  uVar9 = (this->m_writer).m_pos + 4;
  (this->m_writer).m_pos = uVar9;
  if (peVar18->m_size < uVar9) {
    peVar18->m_size = uVar9;
  }
  return;
}

Assistant:

inline void Parser::ParseExpression(SymbolListCItr endSymbol)
	{
		// Check first for an opening bracket, which indicates either an index operator or a key-value pair.
		if (Accept(SymbolType::SquareOpen))
		{
			if (Accept(SymbolType::SquareClose))
			{
				// If we immediately see a close bracket, create an empty collection
				EmitOpcode(Opcode::PushColl);
				EmitCount(0);
			}
			else
			{
				ParseSubexpression(endSymbol);

				// If we see a comma after a square open bracket, we're parsing a key-value pair
				if (Accept(SymbolType::Comma))
				{
					ParseExpression(endSymbol);
					Expect(SymbolType::SquareClose);

					// Parse all subsequent key-value pairs
					uint32_t count = 1;
					while (Accept(SymbolType::Comma))
					{
						Accept(SymbolType::NewLine);
						Expect(SymbolType::SquareOpen);
						ParseSubexpression(endSymbol);
						Expect(SymbolType::Comma);
						ParseSubexpression(endSymbol);
						Expect(SymbolType::SquareClose);
						++count;
					}

					// Pop all key-value pairs and push a new collection onto the stack
					EmitOpcode(Opcode::PushColl);
					EmitCount(count);
				}
				else
				{
					Error("Expected comma separating key-value pair");
				}
			}
		}
		else
		{
			// Advance only to first comma
			auto localEndSymbol = GetNextSymbolOfType(SymbolType::Comma, endSymbol);

			// Parse the first subexpression, defined as any normal expression excluding index operators or lists, 
			// which are handled in this function
			ParseSubexpression(localEndSymbol);

			// If we finish the first subexpression with a common, then we're parsing an indexed list
			if (Accept(SymbolType::Comma))
			{
				// Parse all subexpressions in comma-delimited list
				uint32_t count = 1;
				do
				{
					Accept(SymbolType::NewLine);
					localEndSymbol = GetNextSymbolOfType(SymbolType::Comma, endSymbol);
					ParseSubexpression(localEndSymbol);
					++count;
				} 
				while (Accept(SymbolType::Comma));

				// Pop all key-value pairs and push the results on the stack
				EmitOpcode(Opcode::PushList);
				EmitCount(count);
			}
		}
	}